

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnIfExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  pointer pIVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  Enum local_3c;
  ExprList *local_38;
  ExprList *expr_list;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> local_28;
  __single_object expr;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::IfExpr_*,_std::default_delete<wabt::IfExpr>_>.
  super__Head_base<0UL,_wabt::IfExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::IfExpr,_std::default_delete<wabt::IfExpr>,_true,_true>)
       (__uniq_ptr_data<wabt::IfExpr,_std::default_delete<wabt::IfExpr>,_true,_true>)this;
  std::make_unique<wabt::IfExpr>();
  pIVar2 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->(&local_28);
  expr_list = (ExprList *)sig_type;
  SetBlockDeclaration(this,&(pIVar2->true_).decl,sig_type);
  pIVar2 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->(&local_28);
  local_38 = &(pIVar2->true_).exprs;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::IfExpr,std::default_delete<wabt::IfExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,&local_28);
  local_3c = (Enum)AppendExpr(this,&local_48);
  bVar1 = Failed((Result)local_3c);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  if (bVar1) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    PushLabel(this,If,local_38,(Expr *)0x0);
    Result::Result((Result *)&sig_type_local,Ok);
  }
  std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr(&local_28);
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnIfExpr(Type sig_type) {
  auto expr = std::make_unique<IfExpr>();
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::If, expr_list);
  return Result::Ok;
}